

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int enet_socket_connect(ENetSocket socket,ENetAddress *address)

{
  int *piVar1;
  char *in_RSI;
  int in_EDI;
  int result;
  sockaddr_in sin;
  sockaddr local_20;
  char *local_10;
  int local_8;
  int local_4;
  
  local_10 = in_RSI;
  local_8 = in_EDI;
  memset(&local_20,0,0x10);
  local_20.sa_family = 2;
  local_20.sa_data._0_2_ = htons(*(uint16_t *)(local_10 + 4));
  local_20.sa_data._2_4_ = *(undefined4 *)local_10;
  local_4 = connect(local_8,&local_20,0x10);
  if ((local_4 == -1) && (piVar1 = __errno_location(), *piVar1 == 0x73)) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
enet_socket_connect (ENetSocket socket, const ENetAddress * address)
{
    struct sockaddr_in sin;
    int result;

    memset (& sin, 0, sizeof (struct sockaddr_in));

    sin.sin_family = AF_INET;
    sin.sin_port = ENET_HOST_TO_NET_16 (address -> port);
    sin.sin_addr.s_addr = address -> host;

    result = connect (socket, (struct sockaddr *) & sin, sizeof (struct sockaddr_in));
    if (result == -1 && errno == EINPROGRESS)
      return 0;

    return result;
}